

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

string * deqp::gls::FboUtil::getExtensionDescription
                   (string *__return_storage_ptr__,string *extension)

{
  bool bVar1;
  char *__s;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"GL_",&local_41);
  bVar1 = de::beginsWith(extension,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)extension);
  }
  else {
    bVar1 = std::operator==(extension,"DEQP_gles3_core_compatible");
    if (bVar1) {
      __s = "GLES3 compatible context";
    }
    else {
      bVar1 = std::operator==(extension,"DEQP_gles31_core_compatible");
      if (bVar1) {
        __s = "GLES3.1 compatible context";
      }
      else {
        __s = glcts::fixed_sample_locations_values + 1;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getExtensionDescription (const std::string& extension)
{
	if (de::beginsWith(extension, "GL_"))
		return extension;
	else if (extension == "DEQP_gles3_core_compatible")
		return "GLES3 compatible context";
	else if (extension == "DEQP_gles31_core_compatible")
		return "GLES3.1 compatible context";
	else
	{
		DE_ASSERT(false);
		return "";
	}
}